

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_32x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  int8_t *piVar8;
  int16_t *piVar9;
  long lVar10;
  undefined7 in_register_00000009;
  long lVar11;
  longlong *plVar12;
  ulong uVar13;
  uint uVar14;
  __m256i *in;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i buf0 [32];
  __m256i buf1 [64];
  undefined4 local_c80;
  uint local_c7c;
  int32_t *local_c78;
  code *local_c70 [2];
  longlong local_c60 [128];
  longlong local_860 [262];
  
  piVar8 = av1_fwd_txfm_shift_ls[10];
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_c70[1] = *(code **)((long)col_txfm16x16_arr + uVar13);
  uVar14 = 0xbeaf >> (tx_type & 0x1f);
  local_c70[0] = *(code **)((long)row_txfm16x32_arr + uVar13);
  local_c7c = CONCAT31((int3)(uVar14 >> 8),(byte)uVar14 | 0xf < tx_type);
  local_c80 = 0xd;
  in = (__m256i *)local_c60;
  lVar10 = 0;
  local_c78 = output;
  do {
    if ((local_c7c & 1) == 0) {
      lVar11 = 0x200;
      piVar9 = input;
      do {
        uVar2 = *(undefined8 *)(piVar9 + 4);
        uVar3 = *(undefined8 *)(piVar9 + 8);
        uVar4 = *(undefined8 *)(piVar9 + 0xc);
        *(undefined8 *)((long)&local_c80 + lVar11) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)&local_c78 + lVar11) = uVar2;
        *(undefined8 *)((long)local_c70 + lVar11) = uVar3;
        *(undefined8 *)((long)local_c70 + lVar11 + 8) = uVar4;
        piVar9 = piVar9 + stride;
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != 0);
    }
    else {
      lVar11 = 0;
      piVar9 = input;
      do {
        uVar2 = *(undefined8 *)(piVar9 + 4);
        uVar3 = *(undefined8 *)(piVar9 + 8);
        uVar4 = *(undefined8 *)(piVar9 + 0xc);
        *(undefined8 *)((long)local_c60 + lVar11) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)local_c60 + lVar11 + 8) = uVar2;
        *(undefined8 *)((long)local_c60 + lVar11 + 0x10) = uVar3;
        *(undefined8 *)((long)local_c60 + lVar11 + 0x18) = uVar4;
        lVar11 = lVar11 + 0x20;
        piVar9 = piVar9 + stride;
      } while (lVar11 != 0x200);
    }
    bVar1 = *piVar8;
    uVar14 = (uint)(char)bVar1;
    if ((int)uVar14 < 0) {
      auVar19._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar19._2_2_ = auVar19._0_2_;
      auVar19._4_2_ = auVar19._0_2_;
      auVar19._6_2_ = auVar19._0_2_;
      auVar19._8_2_ = auVar19._0_2_;
      auVar19._10_2_ = auVar19._0_2_;
      auVar19._12_2_ = auVar19._0_2_;
      auVar19._14_2_ = auVar19._0_2_;
      auVar19._16_2_ = auVar19._0_2_;
      auVar19._18_2_ = auVar19._0_2_;
      auVar19._20_2_ = auVar19._0_2_;
      auVar19._22_2_ = auVar19._0_2_;
      auVar19._24_2_ = auVar19._0_2_;
      auVar19._26_2_ = auVar19._0_2_;
      auVar19._28_2_ = auVar19._0_2_;
      auVar19._30_2_ = auVar19._0_2_;
      lVar11 = 0;
      do {
        auVar16 = vpaddsw_avx2(auVar19,*(undefined1 (*) [32])((long)local_c60 + lVar11));
        auVar16 = vpsraw_avx2(auVar16,ZEXT416(-uVar14));
        *(undefined1 (*) [32])((long)local_c60 + lVar11) = auVar16;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar19 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_c60 + lVar11),ZEXT416(uVar14));
        *(undefined1 (*) [32])((long)local_c60 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x200);
    }
    (*local_c70[1])(in,in,local_c80);
    bVar1 = piVar8[1];
    uVar14 = (uint)(char)bVar1;
    if ((int)uVar14 < 0) {
      auVar16._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar16._2_2_ = auVar16._0_2_;
      auVar16._4_2_ = auVar16._0_2_;
      auVar16._6_2_ = auVar16._0_2_;
      auVar16._8_2_ = auVar16._0_2_;
      auVar16._10_2_ = auVar16._0_2_;
      auVar16._12_2_ = auVar16._0_2_;
      auVar16._14_2_ = auVar16._0_2_;
      auVar16._16_2_ = auVar16._0_2_;
      auVar16._18_2_ = auVar16._0_2_;
      auVar16._20_2_ = auVar16._0_2_;
      auVar16._22_2_ = auVar16._0_2_;
      auVar16._24_2_ = auVar16._0_2_;
      auVar16._26_2_ = auVar16._0_2_;
      auVar16._28_2_ = auVar16._0_2_;
      auVar16._30_2_ = auVar16._0_2_;
      lVar11 = 0;
      do {
        auVar19 = vpaddsw_avx2(auVar16,*(undefined1 (*) [32])((long)local_c60 + lVar11));
        auVar19 = vpsraw_avx2(auVar19,ZEXT416(-uVar14));
        *(undefined1 (*) [32])((long)local_c60 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar11 = 0;
      do {
        auVar19 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_c60 + lVar11),ZEXT416(uVar14));
        *(undefined1 (*) [32])((long)local_c60 + lVar11) = auVar19;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0x200);
    }
    transpose_16bit_16x16_avx2(in,(__m256i *)(local_860 + lVar10 * 0x40));
    input = input + 0x10;
    bVar15 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar15);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && 0xf >= tx_type) {
    lVar10 = 0x400;
    plVar12 = local_860;
    do {
      lVar5 = plVar12[1];
      lVar6 = plVar12[2];
      lVar7 = plVar12[3];
      *(longlong *)((long)&local_c80 + lVar10) = *plVar12;
      *(longlong *)((long)&local_c78 + lVar10) = lVar5;
      *(longlong *)((long)local_c70 + lVar10) = lVar6;
      *(longlong *)((long)local_c70 + lVar10 + 8) = lVar7;
      plVar12 = plVar12 + 4;
      lVar10 = lVar10 + -0x20;
    } while (lVar10 != 0);
  }
  else {
    in = (__m256i *)local_860;
  }
  (*local_c70[0])(in,in,0xd);
  bVar1 = piVar8[2];
  if ((char)bVar1 < '\0') {
    auVar20._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar20._2_2_ = auVar20._0_2_;
    auVar20._4_2_ = auVar20._0_2_;
    auVar20._6_2_ = auVar20._0_2_;
    auVar20._8_2_ = auVar20._0_2_;
    auVar20._10_2_ = auVar20._0_2_;
    auVar20._12_2_ = auVar20._0_2_;
    auVar20._14_2_ = auVar20._0_2_;
    auVar20._16_2_ = auVar20._0_2_;
    auVar20._18_2_ = auVar20._0_2_;
    auVar20._20_2_ = auVar20._0_2_;
    auVar20._22_2_ = auVar20._0_2_;
    auVar20._24_2_ = auVar20._0_2_;
    auVar20._26_2_ = auVar20._0_2_;
    auVar20._28_2_ = auVar20._0_2_;
    auVar20._30_2_ = auVar20._0_2_;
    lVar10 = 0;
    do {
      auVar19 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])((long)*in + lVar10));
      auVar19 = vpsraw_avx2(auVar19,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*in + lVar10) = auVar19;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
  }
  else if (bVar1 != 0) {
    lVar10 = 0;
    do {
      auVar19 = vpsllw_avx2(*(undefined1 (*) [32])((long)*in + lVar10),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*in + lVar10) = auVar19;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
  }
  lVar10 = 0;
  auVar17._8_2_ = 1;
  auVar17._0_8_ = 0x1000100010001;
  auVar17._10_2_ = 1;
  auVar17._12_2_ = 1;
  auVar17._14_2_ = 1;
  auVar17._16_2_ = 1;
  auVar17._18_2_ = 1;
  auVar17._20_2_ = 1;
  auVar17._22_2_ = 1;
  auVar17._24_2_ = 1;
  auVar17._26_2_ = 1;
  auVar17._28_2_ = 1;
  auVar17._30_2_ = 1;
  auVar18._8_4_ = 0x80016a1;
  auVar18._0_8_ = 0x80016a1080016a1;
  auVar18._12_4_ = 0x80016a1;
  auVar18._16_4_ = 0x80016a1;
  auVar18._20_4_ = 0x80016a1;
  auVar18._24_4_ = 0x80016a1;
  auVar18._28_4_ = 0x80016a1;
  do {
    auVar16 = vpermq_avx2(*(undefined1 (*) [32])((long)*in + lVar10),0xd8);
    auVar19 = vpunpcklwd_avx2(auVar16,auVar17);
    auVar16 = vpunpckhwd_avx2(auVar16,auVar17);
    auVar19 = vpmaddwd_avx2(auVar19,auVar18);
    auVar20 = vpsrad_avx2(auVar19,0xc);
    auVar19 = vpmaddwd_avx2(auVar16,auVar18);
    auVar19 = vpsrad_avx2(auVar19,0xc);
    *(undefined1 (*) [32])((long)local_c78 + lVar10 * 2) = auVar20;
    *(undefined1 (*) [32])((long)local_c78 + lVar10 * 2 + 0x20) = auVar19;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x400);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 16;
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);
  }

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output, height, width);
}